

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeString(IMkvReader *pReader,longlong pos,longlong size,char **str)

{
  int iVar1;
  char *pcVar2;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long status;
  uchar *buf;
  long required_size;
  unsigned_long_long in_stack_ffffffffffffffc0;
  unsigned_long_long in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if ((void *)*in_RCX != (void *)0x0) {
    operator_delete__((void *)*in_RCX);
  }
  *in_RCX = 0;
  if (((in_RDX < 0x7fffffffffffffff) && (-1 < in_RDX)) && (in_RDX < 0x1312d01)) {
    pcVar2 = SafeArrayAlloc<char>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *in_RCX = (long)pcVar2;
    if (*in_RCX == 0) {
      local_8 = -2;
    }
    else {
      iVar1 = (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX,*in_RCX);
      local_8 = (long)iVar1;
      if (local_8 == 0) {
        *(undefined1 *)(*in_RCX + in_RDX) = 0;
        local_8 = 0;
      }
      else {
        if ((void *)*in_RCX != (void *)0x0) {
          operator_delete__((void *)*in_RCX);
        }
        *in_RCX = 0;
      }
    }
  }
  else {
    local_8 = -2;
  }
  return local_8;
}

Assistant:

long UnserializeString(IMkvReader* pReader, long long pos, long long size,
                       char*& str) {
  delete[] str;
  str = NULL;

  if (size >= LONG_MAX || size < 0 || size > kStringElementSizeLimit)
    return E_FILE_FORMAT_INVALID;

  // +1 for '\0' terminator
  const long required_size = static_cast<long>(size) + 1;

  str = SafeArrayAlloc<char>(1, required_size);
  if (str == NULL)
    return E_FILE_FORMAT_INVALID;

  unsigned char* const buf = reinterpret_cast<unsigned char*>(str);

  const long status = pReader->Read(pos, static_cast<long>(size), buf);

  if (status) {
    delete[] str;
    str = NULL;

    return status;
  }

  str[required_size - 1] = '\0';
  return 0;
}